

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tm.c
# Opt level: O3

void tmCalcFreq(void)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  undefined8 in_RAX;
  undefined4 uVar5;
  undefined4 extraout_var;
  
  uVar1 = rdtsc();
  uVar5 = (undefined4)((ulong)in_RAX >> 0x20);
  uVar2 = rdtsc();
  uVar3 = rdtsc();
  mtSleep(100);
  uVar4 = rdtsc();
  _freq = (((uVar1 & 0xffffffff00000000 | CONCAT44(uVar5,(int)uVar1)) -
           ((uVar3 & 0xffffffff00000000 | CONCAT44(uVar5,(int)uVar3)) +
           (uVar2 & 0xffffffff00000000 | CONCAT44(uVar5,(int)uVar2)))) +
          (uVar4 & 0xffffffff00000000 | CONCAT44(extraout_var,(int)uVar4))) * 10;
  return;
}

Assistant:

static void tmCalcFreq()
{
	tm_ticks_t start;
	tm_ticks_t overhead;
	start = tmTicks();
	overhead = tmTicks() - start;
	start = tmTicks();
	mtSleep(100);
	_freq = tmTicks();
	_freq = (_freq - start - overhead) * 10;
}